

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
gtl::
dense_hashtable<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
::clear(dense_hashtable<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
        *this)

{
  size_type new_num_buckets;
  
  new_num_buckets =
       sh_hashtable_settings<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_unsigned_long,_4>
       ::min_buckets((sh_hashtable_settings<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_unsigned_long,_4>
                      *)this,0,0);
  if ((this->num_elements == 0) && (new_num_buckets == this->num_buckets)) {
    return;
  }
  clear_to_size(this,new_num_buckets);
  return;
}

Assistant:

void clear() {
    // If the table is already empty, and the number of buckets is
    // already as we desire, there's nothing to do.
    const size_type new_num_buckets = settings.min_buckets(0, 0);
    if (num_elements == 0 && new_num_buckets == num_buckets) {
      return;
    }
    clear_to_size(new_num_buckets);
  }